

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O2

void __thiscall mp::PLPoints::PLPoints(PLPoints *this,PLSlopes *pls)

{
  size_type __new_size;
  double dVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  size_t i;
  size_t __n;
  size_type sVar5;
  long lVar6;
  long lVar7;
  longdouble *plVar8;
  long lVar9;
  longdouble lVar10;
  longdouble lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  SmallVec<long_double,_32> YL;
  alloc_ty local_2a1;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  small_vector_base<std::allocator<long_double>,_32U> local_258;
  
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lVar6 = (long)(pls->slopes_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pls->slopes_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar9 = lVar6 >> 3;
  local_2a0 = pls->X0_;
  local_298 = pls->Y0_;
  __new_size = lVar9 + 1;
  std::vector<double,_std::allocator<double>_>::resize(&this->x_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->y_,__new_size);
  gch::detail::small_vector_base<std::allocator<long_double>,_32U>::small_vector_base
            (&local_258,__new_size,&local_2a1);
  pdVar2 = (pls->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)(pls->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar2;
  if (__n != 0) {
    memmove((this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + 1,pdVar2,__n);
  }
  pdVar3 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar3 = pdVar3[1] + -1.0;
  *(double *)((long)pdVar3 + lVar6) = pdVar3[lVar9 + -1] + 1.0;
  dVar1 = *pdVar3;
  uVar12 = SUB84(dVar1,0);
  uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
  pdVar4 = (pls->slopes_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (dVar1 <= local_2a0) {
    local_260 = local_298;
    local_268 = local_2a0;
    lVar10 = (longdouble)0;
  }
  else {
    local_278 = local_2a0;
    local_280 = local_298;
    lVar10 = ((longdouble)dVar1 - (longdouble)local_2a0) * (longdouble)*pdVar4 +
             (longdouble)local_298;
    local_270 = dVar1;
  }
  lVar6 = 0;
  do {
    plVar8 = local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.m_data_ptr
             + lVar6 + 1;
    lVar7 = lVar6;
    while( true ) {
      lVar6 = lVar7 + 1;
      dVar1 = (double)CONCAT44(uVar13,uVar12);
      if (lVar6 - lVar9 == 1) {
        pdVar2 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (sVar5 = 0; __new_size != sVar5; sVar5 = sVar5 + 1) {
          pdVar2[sVar5] =
               (double)(*local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>
                         .m_data_ptr + lVar10);
          local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.m_data_ptr =
               local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.
               m_data_ptr + 1;
        }
        gch::detail::small_vector_base<std::allocator<long_double>,_32U>::~small_vector_base
                  (&local_258);
        return;
      }
      lVar11 = (longdouble)pdVar4[lVar7];
      local_290 = pdVar3[lVar6];
      uVar12 = SUB84(local_290,0);
      uVar13 = (undefined4)((ulong)local_290 >> 0x20);
      *plVar8 = ((longdouble)local_290 - (longdouble)dVar1) * lVar11 + plVar8[-1];
      local_288 = dVar1;
      if ((dVar1 <= local_2a0) && ((lVar6 == lVar9 || (local_2a0 <= local_290)))) break;
      plVar8 = plVar8 + 1;
      lVar7 = lVar6;
    }
    lVar10 = (longdouble)local_298 -
             (plVar8[-1] + (-(longdouble)dVar1 - (longdouble)local_2a0) * lVar11);
  } while( true );
}

Assistant:

PLPoints::PLPoints(const PLSlopes &pls) {
  constexpr auto eps = 1.0;           // works?
  const auto& bp = pls.GetBP();
  const auto& sl = pls.GetSlopes();
  const auto nsl = sl.size();
  const auto X0 = pls.GetX0(), Y0 = pls.GetY0();
  x_.resize(nsl+1);
  y_.resize(nsl+1);
  SmallVec<long double, 32> YL(nsl+1);   // leftmost point: YL[0]=0
  /// Copy and add dummy breakpoints on both ends
  std::copy(bp.begin(), bp.end(), x_.begin()+1);
  x_[0] = x_[1] - eps;
  x_[nsl] = x_[nsl-1] + eps;
  /// Lift the line by this
  long double deltaH {};
  if (x_[0] > X0)                     // if left x > reference point
    deltaH = ((long double)sl[0])
                 * ((long double)x_[0]-X0) + Y0;
  for (size_t i = 0; i < nsl; ++i) {
    assert( x_[i+1] > x_[i] );
    YL[i+1] = YL[i] + sl[i] * ((long double)x_[i+1]-x_[i]);
    if (x_[i]<=X0 && (x_[i+1]>=X0 || i==nsl-1))
      deltaH = Y0 - (YL[i] + sl[i]*(-(long double)x_[i]-X0));
  }
  for (size_t i = 0; i <= nsl; ++i) {
    y_[i] = YL[i] + deltaH;
  }
}